

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O3

bool __thiscall icu_63::SpoofImpl::isIllegalCombiningDotLeadCharacter(SpoofImpl *this,UChar32 cp)

{
  UBool UVar1;
  int32_t offset;
  UChar32 c;
  bool bVar2;
  UnicodeString skelStr;
  UnicodeString local_58;
  
  if ((cp - 0x69U < 4) && (cp - 0x69U != 2)) {
    return true;
  }
  if (cp == 0x131) {
    return true;
  }
  if (cp == 0x237) {
    return true;
  }
  UVar1 = u_hasBinaryProperty_63(cp,UCHAR_SOFT_DOTTED);
  if (UVar1 != '\0') {
    return true;
  }
  local_58.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003febe0;
  local_58.fUnion.fStackFields.fLengthAndFlags = 2;
  SpoofData::confusableLookup(this->fSpoofData,cp,&local_58);
  if (-1 < local_58.fUnion.fStackFields.fLengthAndFlags) {
    local_58.fUnion.fFields.fLength = (int)local_58.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  offset = UnicodeString::moveIndex32(&local_58,local_58.fUnion.fFields.fLength,-1);
  c = UnicodeString::char32At(&local_58,offset);
  if (c != cp) {
    bVar2 = true;
    if ((((c - 0x69U < 4) && (c - 0x69U != 2)) || (c == 0x131)) ||
       ((c == 0x237 || (UVar1 = u_hasBinaryProperty_63(c,UCHAR_SOFT_DOTTED), UVar1 != '\0'))))
    goto LAB_001f34b1;
  }
  bVar2 = false;
LAB_001f34b1:
  UnicodeString::~UnicodeString(&local_58);
  return bVar2;
}

Assistant:

bool SpoofImpl::isIllegalCombiningDotLeadCharacter(UChar32 cp) const {
    if (isIllegalCombiningDotLeadCharacterNoLookup(cp)) {
        return true;
    }
    UnicodeString skelStr;
    fSpoofData->confusableLookup(cp, skelStr);
    UChar32 finalCp = skelStr.char32At(skelStr.moveIndex32(skelStr.length(), -1));
    if (finalCp != cp && isIllegalCombiningDotLeadCharacterNoLookup(finalCp)) {
        return true;
    }
    return false;
}